

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

void RegisterImageIntoTranslationTable
               (TranslationTable *TT,RTLInfoTy *RTL,__tgt_device_image *image)

{
  uint uVar1;
  size_type sVar2;
  reference pp_Var3;
  reference pp_Var4;
  value_type in_RDX;
  vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_> *in_RSI;
  long in_RDI;
  int32_t i;
  uint TargetsTableMinimumSize;
  int local_34;
  undefined4 in_stack_ffffffffffffffe0;
  value_type p_Var5;
  
  uVar1 = *(int *)&(in_RSI->
                   super__Vector_base<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>).
                   _M_impl.super__Vector_impl_data._M_start +
          *(int *)((long)&(in_RSI->
                          super__Vector_base<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4);
  sVar2 = std::vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>::size
                    ((vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_> *)
                     (in_RDI + 0x28));
  if (sVar2 < uVar1) {
    std::vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>::resize
              (in_RSI,(size_type)in_RDX,(value_type *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
    std::vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>::resize
              ((vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_> *)in_RSI,
               (size_type)in_RDX,(value_type *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  }
  for (local_34 = 0;
      local_34 <
      *(int *)((long)&(in_RSI->
                      super__Vector_base<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4); local_34 = local_34 + 1) {
    pp_Var3 = std::vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>::operator[]
                        ((vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_> *)
                         (in_RDI + 0x10),
                         (long)(*(int *)&(in_RSI->
                                         super__Vector_base<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start + local_34));
    p_Var5 = in_RDX;
    if (*pp_Var3 != in_RDX) {
      pp_Var3 = std::vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>::operator[]
                          ((vector<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_> *)
                           (in_RDI + 0x10),
                           (long)(*(int *)&(in_RSI->
                                           super__Vector_base<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start + local_34));
      *pp_Var3 = in_RDX;
      pp_Var4 = std::vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_>::operator[]
                          ((vector<__tgt_target_table_*,_std::allocator<__tgt_target_table_*>_> *)
                           (in_RDI + 0x28),
                           (long)(*(int *)&(in_RSI->
                                           super__Vector_base<__tgt_device_image_*,_std::allocator<__tgt_device_image_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start + local_34));
      *pp_Var4 = (value_type)0x0;
    }
    in_RDX = p_Var5;
  }
  return;
}

Assistant:

static void RegisterImageIntoTranslationTable(TranslationTable &TT,
    RTLInfoTy &RTL, __tgt_device_image *image) {

  // same size, as when we increase one, we also increase the other.
  assert(TT.TargetsTable.size() == TT.TargetsImages.size() &&
         "We should have as many images as we have tables!");

  // Resize the Targets Table and Images to accommodate the new targets if
  // required
  unsigned TargetsTableMinimumSize = RTL.Idx + RTL.NumberOfDevices;

  if (TT.TargetsTable.size() < TargetsTableMinimumSize) {
    TT.TargetsImages.resize(TargetsTableMinimumSize, 0);
    TT.TargetsTable.resize(TargetsTableMinimumSize, 0);
  }

  // Register the image in all devices for this target type.
  for (int32_t i = 0; i < RTL.NumberOfDevices; ++i) {
    // If we are changing the image we are also invalidating the target table.
    if (TT.TargetsImages[RTL.Idx + i] != image) {
      TT.TargetsImages[RTL.Idx + i] = image;
      TT.TargetsTable[RTL.Idx + i] = 0; // lazy initialization of target table.
    }
  }
}